

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

Cnf_Dat_t * Cnf_DeriveFastClauses(Aig_Man_t *p,int nOutputs)

{
  int *piVar1;
  int Entry;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar4;
  Vec_Ptr_t *p_03;
  Vec_Ptr_t *p_04;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_05;
  Aig_Obj_t *pAVar6;
  Cnf_Dat_t *pCVar7;
  int **ppiVar8;
  int iVar9;
  ulong uVar10;
  Vec_Int_t *p_06;
  int iVar11;
  int iVar12;
  int iVar13;
  int i;
  ulong uVar14;
  
  p_00 = Vec_IntAlloc(0x10000);
  p_01 = Vec_IntAlloc(0x1000);
  iVar13 = p->vObjs->nSize;
  p_02 = Vec_IntAlloc(iVar13);
  p_02->nSize = iVar13;
  if (p_02->pArray != (int *)0x0) {
    memset(p_02->pArray,0xff,(long)iVar13 << 2);
  }
  if (nOutputs == 0) {
    iVar13 = 1;
  }
  else if (p->nRegs == 0) {
    if (p->nObjs[3] != nOutputs) {
      __assert_fail("nOutputs == Aig_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                    ,0x234,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
    }
    iVar9 = 0;
    while( true ) {
      iVar13 = iVar9 + 1;
      if (p->vCos->nSize <= iVar9) break;
      pvVar4 = Vec_PtrEntry(p->vCos,iVar9);
      Vec_IntWriteEntry(p_02,*(int *)((long)pvVar4 + 0x24),iVar13);
      iVar9 = iVar13;
    }
  }
  else {
    if (p->nRegs != nOutputs) {
      __assert_fail("nOutputs == Aig_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                    ,0x23a,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
    }
    iVar13 = 1;
    for (iVar9 = p->nObjs[3] - nOutputs; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCos,iVar9);
      Vec_IntWriteEntry(p_02,*(int *)((long)pvVar4 + 0x24),iVar13);
      iVar13 = iVar13 + 1;
    }
  }
  iVar9 = p->vObjs->nSize;
  while (0 < iVar9) {
    pvVar4 = Vec_PtrEntry(p->vObjs,iVar9 + -1);
    if (((pvVar4 == (void *)0x0) || ((*(ulong *)((long)pvVar4 + 0x18) & 0x10) == 0)) ||
       (((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7 < 0xfffffffe)) {
      iVar9 = iVar9 + -1;
    }
    else {
      Vec_IntWriteEntry(p_02,*(int *)((long)pvVar4 + 0x24),iVar13);
      iVar9 = iVar9 + -1;
      iVar13 = iVar13 + 1;
    }
  }
  iVar9 = 0;
  while( true ) {
    if (p->vCis->nSize <= iVar9) break;
    pvVar4 = Vec_PtrEntry(p->vCis,iVar9);
    Vec_IntWriteEntry(p_02,*(int *)((long)pvVar4 + 0x24),iVar13 + iVar9);
    iVar9 = iVar9 + 1;
  }
  pVVar5 = p_02;
  Vec_IntWriteEntry(p_02,p->pConst1->Id,iVar13 + iVar9);
  iVar12 = (int)pVVar5;
  p_03 = Vec_PtrAlloc(iVar12);
  p_04 = Vec_PtrAlloc(iVar12);
  pVVar5 = Vec_IntAlloc(0x10000);
  p_05 = Vec_IntAlloc(100);
  iVar12 = p->vObjs->nSize;
  while (0 < iVar12) {
    iVar12 = iVar12 + -1;
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar12);
    if (((pAVar6 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar6->field_0x18 & 0x10) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)&pAVar6->field_0x18 & 7) - 7)) {
      Cnf_ComputeClauses(p,pAVar6,p_03,p_04,p_02,pVVar5,p_05);
      iVar11 = p_05->nSize;
      i = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      for (; iVar11 != i; i = i + 1) {
        Entry = Vec_IntEntry(p_05,i);
        p_06 = p_00;
        if (Entry == 0) {
          Entry = p_00->nSize;
          p_06 = p_01;
        }
        Vec_IntPush(p_06,Entry);
      }
    }
  }
  Vec_PtrFree(p_03);
  Vec_PtrFree(p_04);
  Vec_IntFree(pVVar5);
  Vec_IntFree(p_05);
  for (iVar12 = 0; iVar12 < p->vCos->nSize; iVar12 = iVar12 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar12);
    uVar2 = Cnf_ObjGetLit(p_02,(Aig_Obj_t *)((ulong)pAVar6->pFanin0 & 0xfffffffffffffffe),
                          (uint)pAVar6->pFanin0 & 1);
    if (iVar12 < p->nObjs[3] - nOutputs) {
      uVar3 = p_00->nSize;
      pVVar5 = p_01;
    }
    else {
      uVar3 = Cnf_ObjGetLit(p_02,pAVar6,0);
      Vec_IntPush(p_01,p_00->nSize);
      Vec_IntPush(p_00,uVar3);
      Vec_IntPush(p_00,uVar2 ^ 1);
      Vec_IntPush(p_01,p_00->nSize);
      uVar3 = uVar3 ^ 1;
      pVVar5 = p_00;
    }
    Vec_IntPush(pVVar5,uVar3);
    Vec_IntPush(p_00,uVar2);
  }
  uVar14 = 0;
  iVar12 = Cnf_ObjGetLit(p_02,p->pConst1,0);
  Vec_IntPush(p_01,p_00->nSize);
  Vec_IntPush(p_00,iVar12);
  pCVar7 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar7->pMan = p;
  pCVar7->nVars = iVar13 + iVar9 + 1;
  iVar13 = p_00->nSize;
  pCVar7->nLiterals = iVar13;
  uVar2 = p_01->nSize;
  pCVar7->nClauses = uVar2;
  ppiVar8 = (int **)malloc((long)(int)uVar2 * 8 + 8);
  pCVar7->pClauses = ppiVar8;
  piVar1 = p_00->pArray;
  p_00->nCap = 0;
  p_00->nSize = 0;
  p_00->pArray = (int *)0x0;
  *ppiVar8 = piVar1;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    iVar9 = Vec_IntEntry(p_01,(int)uVar14);
    ppiVar8[uVar14] = *ppiVar8 + iVar9;
  }
  ppiVar8[(int)uVar2] = *ppiVar8 + iVar13;
  piVar1 = p_02->pArray;
  p_02->nCap = 0;
  p_02->nSize = 0;
  p_02->pArray = (int *)0x0;
  pCVar7->pVarNums = piVar1;
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return pCVar7;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveFastClauses( Aig_Man_t * p, int nOutputs )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vLits, * vClas, * vMap, * vTemp;
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int i, k, nVars, Entry, OutLit, DriLit;

    vLits = Vec_IntAlloc( 1 << 16 );
    vClas = Vec_IntAlloc( 1 << 12 );
    vMap  = Vec_IntStartFull( Aig_ManObjNumMax(p) );

    // assign variables for the outputs
    nVars = 1;
    if ( nOutputs )
    {
        if ( Aig_ManRegNum(p) == 0 )
        {
            assert( nOutputs == Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
        else
        {
            assert( nOutputs == Aig_ManRegNum(p) );
            Aig_ManForEachLiSeq( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
    }
    // assign variables to the internal nodes
    Aig_ManForEachNodeReverse( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    Vec_IntWriteEntry( vMap, Aig_ObjId(Aig_ManConst1(p)), nVars++ );

    // create clauses
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    vTemp   = Vec_IntAlloc( 100 );
    Aig_ManForEachNodeReverse( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_ComputeClauses( p, pObj, vLeaves, vNodes, vMap, vCover, vTemp );
        Vec_IntForEachEntry( vTemp, Entry, k )
        {
            if ( Entry == 0 )
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
            else
                Vec_IntPush( vLits, Entry );
        }       
    }
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    Vec_IntFree( vTemp );

    // create clauses for the outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        DriLit = Cnf_ObjGetLit( vMap, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj) );
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, DriLit );
        }
        else
        {
            OutLit = Cnf_ObjGetLit( vMap, pObj, 0 );
            // first clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit );
            Vec_IntPush( vLits, DriLit ^ 1 );
            // second clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit ^ 1 );
            Vec_IntPush( vLits, DriLit );
        }
    }
 
    // write the constant literal
    OutLit = Cnf_ObjGetLit( vMap, Aig_ManConst1(p), 0 );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntPush( vLits, OutLit );

    // create structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize( vLits );
    pCnf->nClauses  = Vec_IntSize( vClas );
    pCnf->pClauses  = ABC_ALLOC( int *, pCnf->nClauses + 1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray( vLits );
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[pCnf->nClauses] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums  = Vec_IntReleaseArray( vMap );

    // cleanup
    Vec_IntFree( vLits );
    Vec_IntFree( vClas );
    Vec_IntFree( vMap );
    return pCnf;
}